

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterWriteDocCallback(void *context,char *str,int len)

{
  xmlParserErrors error;
  int val;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  
  val = 0;
  error = xmlParseChunk((xmlParserCtxtPtr)context,str,len,0);
  if (error != XML_ERR_OK) {
    xmlWriterErrMsgInt((xmlTextWriterPtr)"xmlTextWriterWriteDocCallback : XML error %d !\n",error,
                       (char *)CONCAT44(extraout_var,extraout_EDX),val);
    len = -1;
  }
  return len;
}

Assistant:

static int
xmlTextWriterWriteDocCallback(void *context, const char *str, int len)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) context;
    int rc;

    if ((rc = xmlParseChunk(ctxt, str, len, 0)) != 0) {
        xmlWriterErrMsgInt(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterWriteDocCallback : XML error %d !\n",
                        rc);
        return -1;
    }

    return len;
}